

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_index.cpp
# Opt level: O2

int32_t __thiscall cornelich::vanilla_index::find_last_cycle(vanilla_index *this)

{
  cycle_formatter *this_00;
  bool bVar1;
  type_conflict1 tVar2;
  int32_t iVar3;
  reference e;
  int32_t iVar4;
  directory_iterator end;
  directory_iterator begin;
  directory_iterator __end1;
  directory_iterator __begin1;
  directory_iterator local_88;
  directory_iterator local_80;
  iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
  local_78;
  vanilla_index *local_68;
  string local_60;
  error_code err;
  
  err.val_ = 0;
  err.failed_ = false;
  err.cat_ = boost::system::system_category();
  local_68 = this;
  std::__cxx11::string::string((string *)&local_60,(string *)this->m_settings);
  boost::filesystem::directory_iterator::directory_iterator(&begin,(path *)&local_60,&err);
  std::__cxx11::string::~string((string *)&local_60);
  end.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
  iVar4 = -1;
  if (err.failed_ == false) {
    bVar1 = boost::filesystem::directory_iterator::equal(&begin,&end);
    if (!bVar1) {
      local_80 = (directory_iterator)(directory_iterator)begin.m_imp.px;
      if (begin.m_imp.px != (dir_itr_imp *)0x0) {
        LOCK();
        *(int *)begin.m_imp.px = *(int *)begin.m_imp.px + 1;
        UNLOCK();
      }
      local_88 = (directory_iterator)(directory_iterator)end.m_imp.px;
      if (end.m_imp.px != (dir_itr_imp *)0x0) {
        LOCK();
        *(int *)end.m_imp.px = *(int *)end.m_imp.px + 1;
        UNLOCK();
      }
      boost::make_iterator_range<boost::filesystem::directory_iterator>
                ((boost *)&local_78,&local_80,&local_88);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_88.m_imp);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_80.m_imp);
      __begin1.m_imp.px =
           (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)
           (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_78.m_Begin;
      if (local_78.m_Begin.m_imp.px != (dir_itr_imp *)0x0) {
        LOCK();
        *(int *)local_78.m_Begin.m_imp.px = *(int *)local_78.m_Begin.m_imp.px + 1;
        UNLOCK();
      }
      __end1.m_imp.px =
           (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)
           (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_78.m_End;
      if (local_78.m_End.m_imp.px != (dir_itr_imp *)0x0) {
        LOCK();
        *(int *)local_78.m_End.m_imp.px = *(int *)local_78.m_End.m_imp.px + 1;
        UNLOCK();
      }
      iVar4 = -1;
      while( true ) {
        tVar2 = boost::iterators::operator!=
                          ((iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                            *)&__begin1,
                           (iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                            *)&__end1);
        if (!tVar2) break;
        e = boost::filesystem::directory_iterator::dereference(&__begin1);
        bVar1 = boost::filesystem::is_directory(e);
        if (bVar1) {
          this_00 = (local_68->m_settings->m_cycle_format).
                    super___shared_ptr<cornelich::cycle_formatter,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          boost::filesystem::path::filename();
          iVar3 = cycle_formatter::cycle_from_date(this_00,&local_60);
          std::__cxx11::string::~string((string *)&local_60);
          if (iVar4 <= iVar3) {
            iVar4 = iVar3;
          }
        }
        boost::filesystem::directory_iterator::increment(&__begin1);
      }
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&__end1.m_imp);
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&__begin1.m_imp);
      boost::iterator_range_detail::
      iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
      ::~iterator_range_base(&local_78);
    }
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&end.m_imp);
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&begin.m_imp);
  return iVar4;
}

Assistant:

std::int32_t vanilla_index::find_last_cycle() const
{
    auto last_cycle = -1;
    boost::system::error_code err;
    fs::directory_iterator begin(m_settings.path(), err);
    fs::directory_iterator end;

    // No directories -> empty
    if(err || begin == end)
        return last_cycle;

    // Find the newest directory
    for(const auto & entry : boost::make_iterator_range(begin, end))
    {
        if(!fs::is_directory(entry))
            continue;
        const auto cycle = m_settings.cycle_format().cycle_from_date(entry.path().filename().string());
        if (last_cycle < cycle)
            last_cycle = cycle;
    }
    return last_cycle;
}